

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O2

void __thiscall Args::CmdLine::printInfoAboutUnknownArgument(CmdLine *this,String *word)

{
  pointer pbVar1;
  bool bVar2;
  BaseException *pBVar3;
  const_iterator __begin3;
  pointer pbVar4;
  allocator local_129;
  String names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  StringList correctNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  correctNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  correctNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  correctNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = isMisspelledName(this,word,&correctNames);
  pbVar1 = correctNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar2) {
    names._M_dataplus._M_p = (pointer)&names.field_2;
    names._M_string_length = 0;
    names.field_2._M_local_buf[0] = '\0';
    if (correctNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        correctNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = true;
      for (pbVar4 = correctNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1
          ) {
        if (!bVar2) {
          std::__cxx11::string::append((char *)&names);
        }
        std::__cxx11::string::append((string *)&names);
        bVar2 = false;
      }
    }
    pBVar3 = (BaseException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_90,"Unknown argument \"",&local_129);
    std::operator+(&local_70,&local_90,word);
    std::operator+(&local_d0,&local_70,"\".\n\nProbably you mean \"");
    std::operator+(&local_108,&local_d0,&names);
    std::operator+(&local_50,&local_108,"\".");
    BaseException::BaseException(pBVar3,&local_50);
    __cxa_throw(pBVar3,&BaseException::typeinfo,BaseException::~BaseException);
  }
  pBVar3 = (BaseException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_108,"Unknown argument \"",(allocator *)&local_d0);
  std::operator+(&names,&local_108,word);
  std::operator+(&local_b0,&names,"\".");
  BaseException::BaseException(pBVar3,&local_b0);
  __cxa_throw(pBVar3,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

void printInfoAboutUnknownArgument( const String & word )
	{
		StringList correctNames;

		if( isMisspelledName( word, correctNames ) )
		{
			const String names = details::formatCorrectNamesString(
				correctNames );

			throw BaseException( String( SL( "Unknown argument \"" ) ) +
				word + SL( "\".\n\nProbably you mean \"" ) + names +
				SL( "\"." ) );
		}
		else
			throw BaseException( String( SL( "Unknown argument \"" ) ) +
				word + SL( "\"." ) );
	}